

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_names.cc
# Opt level: O1

bool prometheus::CheckMetricName(string *name)

{
  byte *pbVar1;
  byte bVar2;
  ulong uVar3;
  bool bVar4;
  byte *pbVar5;
  byte *pbVar6;
  long lVar7;
  
  bVar4 = anon_unknown_3::nameStartsValid(name);
  if (!bVar4) {
    return false;
  }
  pbVar5 = (byte *)(name->_M_dataplus)._M_p;
  uVar3 = name->_M_string_length;
  pbVar1 = pbVar5 + uVar3;
  pbVar6 = pbVar5;
  if (0 < (long)uVar3 >> 2) {
    pbVar6 = pbVar5 + (uVar3 & 0xfffffffffffffffc);
    lVar7 = ((long)uVar3 >> 2) + 1;
    pbVar5 = pbVar5 + 3;
    do {
      bVar2 = pbVar5[-3];
      if ((((9 < (byte)(bVar2 - 0x30)) && (0x19 < (byte)((bVar2 & 0xdf) + 0xbf))) && (bVar2 != 0x5f)
          ) && (bVar2 != 0x3a)) {
        pbVar5 = pbVar5 + -3;
        goto LAB_00141d04;
      }
      bVar2 = pbVar5[-2];
      if (((9 < (byte)(bVar2 - 0x30)) && (0x19 < (byte)((bVar2 & 0xdf) + 0xbf))) &&
         ((bVar2 != 0x5f && (bVar2 != 0x3a)))) {
        pbVar5 = pbVar5 + -2;
        goto LAB_00141d04;
      }
      bVar2 = pbVar5[-1];
      if (((9 < (byte)(bVar2 - 0x30)) && (0x19 < (byte)((bVar2 & 0xdf) + 0xbf))) &&
         ((bVar2 != 0x5f && (bVar2 != 0x3a)))) {
        pbVar5 = pbVar5 + -1;
        goto LAB_00141d04;
      }
      bVar2 = *pbVar5;
      if ((((9 < (byte)(bVar2 - 0x30)) && (0x19 < (byte)((bVar2 & 0xdf) + 0xbf))) && (bVar2 != 0x5f)
          ) && (bVar2 != 0x3a)) goto LAB_00141d04;
      lVar7 = lVar7 + -1;
      pbVar5 = pbVar5 + 4;
    } while (1 < lVar7);
  }
  lVar7 = (long)pbVar1 - (long)pbVar6;
  if (lVar7 != 1) {
    if (lVar7 != 2) {
      pbVar5 = pbVar1;
      if ((lVar7 != 3) ||
         (((bVar2 = *pbVar6, 9 < (byte)(bVar2 - 0x30) && (0x19 < (byte)((bVar2 & 0xdf) + 0xbf))) &&
          ((bVar2 != 0x5f && (pbVar5 = pbVar6, bVar2 != 0x3a)))))) goto LAB_00141d04;
      pbVar6 = pbVar6 + 1;
    }
    bVar2 = *pbVar6;
    if (((9 < (byte)(bVar2 - 0x30)) && (0x19 < (byte)((bVar2 & 0xdf) + 0xbf))) &&
       ((bVar2 != 0x5f && (pbVar5 = pbVar6, bVar2 != 0x3a)))) goto LAB_00141d04;
    pbVar6 = pbVar6 + 1;
  }
  bVar2 = *pbVar6;
  if (((byte)(bVar2 + 0x9f) < 0x1a || (byte)(bVar2 - 0x30) < 10) || (byte)(bVar2 + 0xbf) < 0x1a) {
    pbVar6 = pbVar1;
  }
  if (bVar2 == 0x5f) {
    pbVar6 = pbVar1;
  }
  pbVar5 = pbVar6;
  if (bVar2 == 0x3a) {
    pbVar5 = pbVar1;
  }
LAB_00141d04:
  return pbVar5 == pbVar1;
}

Assistant:

bool CheckMetricName(const std::string& name) {
  if (!nameStartsValid(name)) {
    return false;
  }

  auto validMetricCharacters = [](char c) {
    return isLocaleIndependentAlphaNumeric(c) || c == '_' || c == ':';
  };

  auto mismatch =
      std::find_if_not(std::begin(name), std::end(name), validMetricCharacters);
  return mismatch == std::end(name);
}